

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

char * __thiscall
gl4cts::anon_unknown_0::ShaderStorageBufferObjectBase::GLenumToString
          (ShaderStorageBufferObjectBase *this,GLenum e)

{
  GLenum e_local;
  ShaderStorageBufferObjectBase *this_local;
  
  if (e == 0x8f39) {
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_21b317;
  }
  else if (e == 0x90d3) {
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_21b257;
  }
  else if (e == 0x90d4) {
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_21b263;
  }
  else if (e == 0x90d5) {
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_21b27b;
  }
  else if (e == 0x90d6) {
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_21b293;
  }
  else if (e == 0x90d7) {
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_21b2c3;
  }
  else if (e == 0x90d8) {
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_21b2ab;
  }
  else if (e == 0x90d9) {
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_21b2b7;
  }
  else if (e == 0x90da) {
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_21b2db;
  }
  else if (e == 0x90db) {
    this_local = (ShaderStorageBufferObjectBase *)0x2c4585f;
  }
  else if (e == 0x90dc) {
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_21b2f3;
  }
  else if (e == 0x90dd) {
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_21b30b;
  }
  else if (e == 0x90de) {
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_21b2ff;
  }
  else {
    if (e != 0x90df) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderStorageBufferObjectTests.cpp"
                    ,0x25a,
                    "const char *gl4cts::(anonymous namespace)::ShaderStorageBufferObjectBase::GLenumToString(GLenum)"
                   );
    }
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_21b323;
  }
  return (char *)this_local;
}

Assistant:

const char* GLenumToString(GLenum e)
	{
		switch (e)
		{
		case GL_SHADER_STORAGE_BUFFER_BINDING:
			return "GL_SHADER_STORAGE_BUFFER_BINDING";
		case GL_SHADER_STORAGE_BUFFER_START:
			return "GL_SHADER_STORAGE_BUFFER_START";
		case GL_SHADER_STORAGE_BUFFER_SIZE:
			return "GL_SHADER_STORAGE_BUFFER_SIZE";
		case GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS:
			return "GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS";
		case GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS:
			return "GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS";
		case GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS:
			return "GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS";
		case GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS:
			return "GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS";
		case GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS:
			return "GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS";
		case GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS:
			return "GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS";
		case GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS:
			return "GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS";
		case GL_MAX_SHADER_STORAGE_BLOCK_SIZE:
			return "GL_MAX_SHADER_STORAGE_BLOCK_SIZE";
		case GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS:
			return "GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS";
		case GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES:
			return "GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES";
		case GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT:
			return "GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT";

		default:
			assert(0);
			break;
		}
		return NULL;
	}